

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void __thiscall duckdb_shell::ShellState::ClearTempFile(ShellState *this)

{
  int iVar1;
  char *in_RDI;
  
  if (((*(long *)(in_RDI + 0x58) != 0) && (in_RDI[9] == '\0')) &&
     (iVar1 = shellDeleteFile(in_RDI), iVar1 == 0)) {
    duckdb_shell_sqlite3_free((void *)0x1dcb0c);
    in_RDI[0x58] = '\0';
    in_RDI[0x59] = '\0';
    in_RDI[0x5a] = '\0';
    in_RDI[0x5b] = '\0';
    in_RDI[0x5c] = '\0';
    in_RDI[0x5d] = '\0';
    in_RDI[0x5e] = '\0';
    in_RDI[0x5f] = '\0';
  }
  return;
}

Assistant:

void ShellState::ClearTempFile() {
	if (zTempFile == 0)
		return;
	if (doXdgOpen)
		return;
	if (shellDeleteFile(zTempFile))
		return;
	sqlite3_free(zTempFile);
	zTempFile = 0;
}